

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O2

bool __thiscall
cmFileCopier::Run(cmFileCopier *this,
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *args)

{
  cmCommand *this_00;
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  pointer in_name;
  bool bVar3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  fromPathComponents;
  string fromName;
  string file;
  string fromFile;
  string fromDir;
  string toFile;
  
  iVar2 = (*this->_vptr_cmFileCopier[6])();
  if ((char)iVar2 == '\0') {
LAB_002e0996:
    bVar3 = false;
  }
  else {
    in_name = (this->Files).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      bVar3 = in_name ==
              (this->Files).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
      if (bVar3) {
        return bVar3;
      }
      file._M_dataplus._M_p = (pointer)&file.field_2;
      file._M_string_length = 0;
      file.field_2._M_local_buf[0] = '\0';
      if ((in_name->_M_string_length == 0) ||
         (bVar1 = cmsys::SystemTools::FileIsFullPath(in_name), bVar1)) {
        if ((this->FilesFromDir)._M_string_length != 0) {
          this_00 = &this->FileCommand->super_cmCommand;
          std::__cxx11::string::string
                    ((string *)&fromName,
                     "option FILES_FROM_DIR requires all files to be specified as relative paths.",
                     (allocator *)&fromDir);
          cmCommand::SetError(this_00,&fromName);
          std::__cxx11::string::~string((string *)&fromName);
          std::__cxx11::string::~string((string *)&file);
          goto LAB_002e0996;
        }
        std::__cxx11::string::_M_assign((string *)&file);
      }
      else {
        if ((this->FilesFromDir)._M_string_length == 0) {
          cmMakefile::GetCurrentSourceDirectory(this->Makefile);
          std::__cxx11::string::assign((char *)&file);
        }
        else {
          std::__cxx11::string::_M_assign((string *)&file);
        }
        std::__cxx11::string::append((char *)&file);
        std::__cxx11::string::append((string *)&file);
      }
      fromPathComponents.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      fromPathComponents.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      fromPathComponents.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      cmsys::SystemTools::SplitPath(&file,&fromPathComponents,true);
      std::__cxx11::string::string
                ((string *)&fromName,
                 (string *)
                 (fromPathComponents.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish + -1));
      cmsys::SystemTools::JoinPath
                (&fromDir,(const_iterator)
                          fromPathComponents.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                 fromPathComponents.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish + -1);
      std::__cxx11::string::string((string *)&toFile,(string *)&this->Destination);
      if ((this->FilesFromDir)._M_string_length != 0) {
        cmsys::SystemTools::GetFilenamePath(&fromFile,in_name);
        if (fromFile._M_string_length != 0) {
          std::__cxx11::string::append((char *)&toFile);
          std::__cxx11::string::append((string *)&toFile);
        }
        std::__cxx11::string::~string((string *)&fromFile);
      }
      iVar2 = (*this->_vptr_cmFileCopier[3])(this,&fromName);
      if (*(long *)(CONCAT44(extraout_var,iVar2) + 8) != 0) {
        std::__cxx11::string::append((char *)&toFile);
        std::__cxx11::string::append((string *)&toFile);
      }
      std::__cxx11::string::string((string *)&fromFile,(string *)&fromDir);
      if (fromName._M_string_length != 0) {
        std::__cxx11::string::append((char *)&fromFile);
        std::__cxx11::string::append((string *)&fromFile);
      }
      iVar2 = (*this->_vptr_cmFileCopier[2])(this,fromFile._M_dataplus._M_p,toFile._M_dataplus._M_p)
      ;
      std::__cxx11::string::~string((string *)&fromFile);
      std::__cxx11::string::~string((string *)&toFile);
      std::__cxx11::string::~string((string *)&fromDir);
      std::__cxx11::string::~string((string *)&fromName);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&fromPathComponents);
      std::__cxx11::string::~string((string *)&file);
      in_name = in_name + 1;
    } while ((char)iVar2 != '\0');
  }
  return bVar3;
}

Assistant:

bool cmFileCopier::Run(std::vector<std::string> const& args)
{
  if (!this->Parse(args)) {
    return false;
  }

  for (std::vector<std::string>::const_iterator i = this->Files.begin();
       i != this->Files.end(); ++i) {
    std::string file;
    if (!i->empty() && !cmSystemTools::FileIsFullPath(*i)) {
      if (!this->FilesFromDir.empty()) {
        file = this->FilesFromDir;
      } else {
        file = this->Makefile->GetCurrentSourceDirectory();
      }
      file += "/";
      file += *i;
    } else if (!this->FilesFromDir.empty()) {
      this->FileCommand->SetError("option FILES_FROM_DIR requires all files "
                                  "to be specified as relative paths.");
      return false;
    } else {
      file = *i;
    }

    // Split the input file into its directory and name components.
    std::vector<std::string> fromPathComponents;
    cmSystemTools::SplitPath(file, fromPathComponents);
    std::string fromName = *(fromPathComponents.end() - 1);
    std::string fromDir = cmSystemTools::JoinPath(
      fromPathComponents.begin(), fromPathComponents.end() - 1);

    // Compute the full path to the destination file.
    std::string toFile = this->Destination;
    if (!this->FilesFromDir.empty()) {
      std::string dir = cmSystemTools::GetFilenamePath(*i);
      if (!dir.empty()) {
        toFile += "/";
        toFile += dir;
      }
    }
    std::string const& toName = this->ToName(fromName);
    if (!toName.empty()) {
      toFile += "/";
      toFile += toName;
    }

    // Construct the full path to the source file.  The file name may
    // have been changed above.
    std::string fromFile = fromDir;
    if (!fromName.empty()) {
      fromFile += "/";
      fromFile += fromName;
    }

    if (!this->Install(fromFile.c_str(), toFile.c_str())) {
      return false;
    }
  }
  return true;
}